

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

uint write_until_data_queued(void)

{
  int iVar1;
  uv_write_t *req;
  ulong uVar2;
  
  req = write_reqs;
  uVar2 = 0;
  do {
    iVar1 = uv_write(req,(uv_stream_t *)&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x347,"r == 0");
      abort();
    }
    if (0x12a < uVar2) break;
    uVar2 = uVar2 + 1;
    req = req + 1;
  } while (channel.write_queue_size == 0);
  return (uint)channel.write_queue_size;
}

Assistant:

static unsigned int write_until_data_queued() {
  unsigned int i;
  int r;

  i = 0;
  do {
    r = uv_write(&write_reqs[i],
                 (uv_stream_t*)&channel,
                 &large_buf,
                 1,
                 closed_handle_large_write_cb);
    ASSERT(r == 0);
    i++;
  } while (channel.write_queue_size == 0 &&
           i < ARRAY_SIZE(write_reqs));

  return channel.write_queue_size;
}